

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxout.cpp
# Opt level: O0

void __thiscall soplex::SPxOut::SPxOut(SPxOut *this)

{
  undefined8 *in_RDI;
  int i;
  int in_stack_0000002c;
  basic_ostream<char,_std::char_traits<char>_> ***in_stack_00000030;
  int local_c;
  
  *in_RDI = &PTR__SPxOut_004ea898;
  *(undefined4 *)(in_RDI + 1) = 0;
  in_RDI[2] = 0;
  spx_alloc<std::ostream**>(in_stack_00000030,in_stack_0000002c);
  in_RDI[2] = in_RDI[2];
  *(undefined8 **)(in_RDI[2] + 8) = &std::cerr;
  *(undefined8 **)in_RDI[2] = &std::cerr;
  for (local_c = 2; local_c < 6; local_c = local_c + 1) {
    *(undefined8 **)(in_RDI[2] + (long)local_c * 8) = &std::cout;
  }
  return;
}

Assistant:

SPxOut::SPxOut()
   : m_verbosity(ERROR)
   , m_streams(nullptr)
{
   spx_alloc(m_streams, INFO3 + 1);
   m_streams = new(m_streams) std::ostream*[INFO3 + 1];
   m_streams[ ERROR ] = m_streams[ WARNING ] = &std::cerr;

   for(int i = DEBUG; i <= INFO3; ++i)
      m_streams[ i ] = &std::cout;
}